

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall Catch::XmlReporter::assertionEnded(XmlReporter *this,AssertionStats *assertionStats)

{
  AssertionResult *this_00;
  SourceLineInfo *pSVar1;
  XmlWriter *this_01;
  OfType OVar2;
  pointer pMVar3;
  XmlReporter *pXVar4;
  int iVar5;
  XmlWriter *pXVar6;
  pointer pMVar7;
  string *psVar8;
  string local_160;
  string local_140;
  string local_120;
  XmlReporter *local_100;
  string local_f8;
  undefined1 local_d8 [32];
  SourceLineInfo local_b8;
  undefined1 local_90 [40];
  string local_68;
  allocator local_43;
  allocator local_42;
  allocator local_41;
  AssertionStats *local_40;
  allocator local_32;
  allocator local_31;
  
  local_100 = this;
  local_40 = assertionStats;
  if ((assertionStats->assertionResult).m_resultData.resultType != Ok) {
    pMVar3 = (assertionStats->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    psVar8 = (string *)(local_d8 + 0x20);
    for (pMVar7 = (assertionStats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start; pMVar7 != pMVar3; pMVar7 = pMVar7 + 1) {
      if (pMVar7->type == Warning) {
        std::__cxx11::string::string(psVar8,"Warning",(allocator *)(local_90 + 0x28));
        XmlWriter::scopedElement((XmlWriter *)local_90,(string *)&this->m_xml);
        XmlWriter::writeText((XmlWriter *)local_90._0_8_,&pMVar7->message,true);
LAB_0013f0bc:
        XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_90);
        std::__cxx11::string::~string(psVar8);
      }
      else if (pMVar7->type == Info) {
        std::__cxx11::string::string(psVar8,"Info",(allocator *)(local_90 + 0x28));
        XmlWriter::scopedElement((XmlWriter *)local_90,(string *)&this->m_xml);
        XmlWriter::writeText((XmlWriter *)local_90._0_8_,&pMVar7->message,true);
        goto LAB_0013f0bc;
      }
    }
  }
  pXVar4 = local_100;
  iVar5 = (*(((local_100->super_StreamingReporterBase).m_config.m_p)->super_IShared).
            super_NonCopyable._vptr_NonCopyable[7])();
  if (((char)iVar5 == '\0') &&
     (((local_40->assertionResult).m_resultData.resultType & FailureBit) == Ok)) {
    return true;
  }
  if ((local_40->assertionResult).m_info.capturedExpression._M_string_length != 0) {
    std::__cxx11::string::string((string *)(local_90 + 0x28),"Expression",&local_32);
    this_01 = &pXVar4->m_xml;
    pXVar6 = XmlWriter::startElement(this_01,(string *)(local_90 + 0x28));
    std::__cxx11::string::string((string *)&local_f8,"success",&local_31);
    pXVar6 = XmlWriter::writeAttribute
                       (pXVar6,&local_f8,
                        ((local_40->assertionResult).m_resultData.resultType & FailureBit) == Ok);
    std::__cxx11::string::string((string *)&local_140,"type",&local_43);
    this_00 = &local_40->assertionResult;
    std::__cxx11::string::string((string *)&local_120,(string *)this_00);
    pXVar6 = XmlWriter::writeAttribute(pXVar6,&local_140,&local_120);
    std::__cxx11::string::string((string *)local_d8,"filename",&local_42);
    pSVar1 = &(local_40->assertionResult).m_info.lineInfo;
    SourceLineInfo::SourceLineInfo((SourceLineInfo *)(local_d8 + 0x20),pSVar1);
    pXVar6 = XmlWriter::writeAttribute(pXVar6,(string *)local_d8,(string *)(local_d8 + 0x20));
    std::__cxx11::string::string((string *)&local_160,"line",&local_41);
    SourceLineInfo::SourceLineInfo((SourceLineInfo *)local_90,pSVar1);
    XmlWriter::writeAttribute<unsigned_long>(pXVar6,&local_160,(unsigned_long *)(local_90 + 0x20));
    std::__cxx11::string::~string((string *)local_90);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)(local_d8 + 0x20));
    std::__cxx11::string::~string((string *)local_d8);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)(local_90 + 0x28));
    std::__cxx11::string::string((string *)(local_d8 + 0x20),"Original",(allocator *)&local_f8);
    XmlWriter::scopedElement((XmlWriter *)(local_90 + 0x28),(string *)this_01);
    AssertionResult::getExpression_abi_cxx11_((string *)local_90,this_00);
    XmlWriter::writeText((XmlWriter *)local_68._M_dataplus._M_p,(string *)local_90,true);
    std::__cxx11::string::~string((string *)local_90);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)(local_90 + 0x28));
    std::__cxx11::string::~string((string *)(local_d8 + 0x20));
    std::__cxx11::string::string((string *)(local_d8 + 0x20),"Expanded",(allocator *)&local_f8);
    XmlWriter::scopedElement((XmlWriter *)(local_90 + 0x28),(string *)this_01);
    std::__cxx11::string::string
              ((string *)local_90,(string *)&(local_40->assertionResult).m_resultData);
    XmlWriter::writeText((XmlWriter *)local_68._M_dataplus._M_p,(string *)local_90,true);
    std::__cxx11::string::~string((string *)local_90);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)(local_90 + 0x28));
    std::__cxx11::string::~string((string *)(local_d8 + 0x20));
  }
  OVar2 = (local_40->assertionResult).m_resultData.resultType;
  if (OVar2 == Info) {
    std::__cxx11::string::string((string *)(local_d8 + 0x20),"Info",(allocator *)&local_f8);
    XmlWriter::scopedElement((XmlWriter *)(local_90 + 0x28),(string *)&pXVar4->m_xml);
    std::__cxx11::string::string
              ((string *)local_90,(string *)&(local_40->assertionResult).m_resultData.message);
    XmlWriter::writeText((XmlWriter *)local_68._M_dataplus._M_p,(string *)local_90,true);
LAB_0013f676:
    std::__cxx11::string::~string((string *)local_90);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)(local_90 + 0x28));
    psVar8 = (string *)(local_d8 + 0x20);
  }
  else {
    if (OVar2 == ExplicitFailure) {
      std::__cxx11::string::string((string *)(local_d8 + 0x20),"Failure",(allocator *)&local_f8);
      XmlWriter::scopedElement((XmlWriter *)(local_90 + 0x28),(string *)&pXVar4->m_xml);
      std::__cxx11::string::string
                ((string *)local_90,(string *)&(local_40->assertionResult).m_resultData.message);
      XmlWriter::writeText((XmlWriter *)local_68._M_dataplus._M_p,(string *)local_90,true);
      goto LAB_0013f676;
    }
    if (OVar2 == FatalErrorCondition) {
      std::__cxx11::string::string
                ((string *)(local_90 + 0x28),"Fatal Error Condition",(allocator *)&local_160);
      XmlWriter::scopedElement((XmlWriter *)local_d8,(string *)&pXVar4->m_xml);
      std::__cxx11::string::string((string *)&local_f8,"filename",&local_32);
      pSVar1 = &(local_40->assertionResult).m_info.lineInfo;
      SourceLineInfo::SourceLineInfo((SourceLineInfo *)(local_d8 + 0x20),pSVar1);
      XmlWriter::writeAttribute((XmlWriter *)local_d8._0_8_,&local_f8,(string *)(local_d8 + 0x20));
      std::__cxx11::string::string((string *)&local_140,"line",&local_31);
      SourceLineInfo::SourceLineInfo((SourceLineInfo *)local_90,pSVar1);
      XmlWriter::writeAttribute<unsigned_long>
                ((XmlWriter *)local_d8._0_8_,&local_140,(unsigned_long *)(local_90 + 0x20));
      std::__cxx11::string::string
                ((string *)&local_120,(string *)&(local_40->assertionResult).m_resultData.message);
      XmlWriter::writeText((XmlWriter *)local_d8._0_8_,&local_120,true);
    }
    else {
      if (OVar2 != ThrewException) goto LAB_0013f697;
      std::__cxx11::string::string((string *)(local_90 + 0x28),"Exception",(allocator *)&local_160);
      XmlWriter::scopedElement((XmlWriter *)local_d8,(string *)&pXVar4->m_xml);
      std::__cxx11::string::string((string *)&local_f8,"filename",&local_32);
      pSVar1 = &(local_40->assertionResult).m_info.lineInfo;
      SourceLineInfo::SourceLineInfo((SourceLineInfo *)(local_d8 + 0x20),pSVar1);
      XmlWriter::writeAttribute((XmlWriter *)local_d8._0_8_,&local_f8,(string *)(local_d8 + 0x20));
      std::__cxx11::string::string((string *)&local_140,"line",&local_31);
      SourceLineInfo::SourceLineInfo((SourceLineInfo *)local_90,pSVar1);
      XmlWriter::writeAttribute<unsigned_long>
                ((XmlWriter *)local_d8._0_8_,&local_140,(unsigned_long *)(local_90 + 0x20));
      std::__cxx11::string::string
                ((string *)&local_120,(string *)&(local_40->assertionResult).m_resultData.message);
      XmlWriter::writeText((XmlWriter *)local_d8._0_8_,&local_120,true);
    }
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)local_90);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)(local_d8 + 0x20));
    std::__cxx11::string::~string((string *)&local_f8);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_d8);
    psVar8 = (string *)(local_90 + 0x28);
  }
  std::__cxx11::string::~string(psVar8);
LAB_0013f697:
  if ((local_40->assertionResult).m_info.capturedExpression._M_string_length != 0) {
    XmlWriter::endElement(&pXVar4->m_xml);
  }
  return true;
}

Assistant:

virtual bool assertionEnded( AssertionStats const& assertionStats ) {
            const AssertionResult& assertionResult = assertionStats.assertionResult;

            // Print any info messages in <Info> tags.
            if( assertionStats.assertionResult.getResultType() != ResultWas::Ok ) {
                for( std::vector<MessageInfo>::const_iterator it = assertionStats.infoMessages.begin(), itEnd = assertionStats.infoMessages.end();
                        it != itEnd;
                        ++it ) {
                    if( it->type == ResultWas::Info ) {
                        m_xml.scopedElement( "Info" )
                            .writeText( it->message );
                    } else if ( it->type == ResultWas::Warning ) {
                        m_xml.scopedElement( "Warning" )
                            .writeText( it->message );
                    }
                }
            }

            // Drop out if result was successful but we're not printing them.
            if( !m_config->includeSuccessfulResults() && isOk(assertionResult.getResultType()) )
                return true;

            // Print the expression if there is one.
            if( assertionResult.hasExpression() ) {
                m_xml.startElement( "Expression" )
                    .writeAttribute( "success", assertionResult.succeeded() )
					.writeAttribute( "type", assertionResult.getTestMacroName() )
                    .writeAttribute( "filename", assertionResult.getSourceInfo().file )
                    .writeAttribute( "line", assertionResult.getSourceInfo().line );

                m_xml.scopedElement( "Original" )
                    .writeText( assertionResult.getExpression() );
                m_xml.scopedElement( "Expanded" )
                    .writeText( assertionResult.getExpandedExpression() );
            }

            // And... Print a result applicable to each result type.
            switch( assertionResult.getResultType() ) {
                case ResultWas::ThrewException:
                    m_xml.scopedElement( "Exception" )
                        .writeAttribute( "filename", assertionResult.getSourceInfo().file )
                        .writeAttribute( "line", assertionResult.getSourceInfo().line )
                        .writeText( assertionResult.getMessage() );
                    break;
                case ResultWas::FatalErrorCondition:
                    m_xml.scopedElement( "Fatal Error Condition" )
                        .writeAttribute( "filename", assertionResult.getSourceInfo().file )
                        .writeAttribute( "line", assertionResult.getSourceInfo().line )
                        .writeText( assertionResult.getMessage() );
                    break;
                case ResultWas::Info:
                    m_xml.scopedElement( "Info" )
                        .writeText( assertionResult.getMessage() );
                    break;
                case ResultWas::Warning:
                    // Warning will already have been written
                    break;
                case ResultWas::ExplicitFailure:
                    m_xml.scopedElement( "Failure" )
                        .writeText( assertionResult.getMessage() );
                    break;
                default:
                    break;
            }

            if( assertionResult.hasExpression() )
                m_xml.endElement();

            return true;
        }